

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  char cVar1;
  char local_2e;
  char local_2d;
  uint32_t local_2c;
  char_t ch_1;
  char_t ch;
  char *pcStack_28;
  uint ucsc;
  char_t *stre;
  gap *g_local;
  char_t *s_local;
  
  pcStack_28 = s + 1;
  cVar1 = *pcStack_28;
  if (cVar1 != '#') {
    if (cVar1 == 'a') {
      pcStack_28 = s + 2;
      if (*pcStack_28 == 'm') {
        pcStack_28 = s + 3;
        if ((s[3] == 'p') && (pcStack_28 = s + 4, s[4] == ';')) {
          g_local = (gap *)(s + 1);
          *s = '&';
          gap::push(g,(char_t **)&g_local,(long)(s + 5) - (long)g_local);
          return s + 5;
        }
      }
      else if ((((*pcStack_28 == 'p') && (pcStack_28 = s + 3, s[3] == 'o')) &&
               (pcStack_28 = s + 4, s[4] == 's')) && (pcStack_28 = s + 5, s[5] == ';')) {
        g_local = (gap *)(s + 1);
        *s = '\'';
        gap::push(g,(char_t **)&g_local,(long)(s + 6) - (long)g_local);
        return s + 6;
      }
    }
    else if (cVar1 == 'g') {
      pcStack_28 = s + 2;
      if ((s[2] == 't') && (pcStack_28 = s + 3, s[3] == ';')) {
        g_local = (gap *)(s + 1);
        *s = '>';
        gap::push(g,(char_t **)&g_local,(long)(s + 4) - (long)g_local);
        return s + 4;
      }
    }
    else if (cVar1 == 'l') {
      pcStack_28 = s + 2;
      if ((s[2] == 't') && (pcStack_28 = s + 3, s[3] == ';')) {
        g_local = (gap *)(s + 1);
        *s = '<';
        gap::push(g,(char_t **)&g_local,(long)(s + 4) - (long)g_local);
        return s + 4;
      }
    }
    else if ((((cVar1 == 'q') && (pcStack_28 = s + 2, s[2] == 'u')) &&
             (pcStack_28 = s + 3, s[3] == 'o')) &&
            ((pcStack_28 = s + 4, s[4] == 't' && (pcStack_28 = s + 5, s[5] == ';')))) {
      g_local = (gap *)(s + 1);
      *s = '\"';
      gap::push(g,(char_t **)&g_local,(long)(s + 6) - (long)g_local);
      return s + 6;
    }
    return pcStack_28;
  }
  local_2c = 0;
  if (s[2] == 'x') {
    pcStack_28 = s + 3;
    local_2d = *pcStack_28;
    if (local_2d == ';') {
      return pcStack_28;
    }
    do {
      if ((int)local_2d - 0x30U < 10) {
        local_2c = local_2c * 0x10 + local_2d + -0x30;
      }
      else {
        if (5 < ((int)local_2d | 0x20U) - 0x61) goto LAB_00163db5;
        local_2c = local_2c * 0x10 + (((int)local_2d | 0x20U) - 0x57);
      }
      local_2d = pcStack_28[1];
      pcStack_28 = pcStack_28 + 1;
    } while( true );
  }
  pcStack_28 = s + 2;
  local_2e = s[2];
  if (local_2e == ';') {
    return pcStack_28;
  }
  while ((int)local_2e - 0x30U < 10) {
    local_2c = local_2c * 10 + local_2e + -0x30;
    local_2e = pcStack_28[1];
    pcStack_28 = pcStack_28 + 1;
  }
  if (local_2e != ';') {
    return pcStack_28;
  }
LAB_00163e7d:
  pcStack_28 = pcStack_28 + 1;
  g_local = (gap *)s;
  g_local = (gap *)utf8_writer::any((value_type)s,local_2c);
  gap::push(g,(char_t **)&g_local,(long)pcStack_28 - (long)g_local);
  return pcStack_28;
LAB_00163db5:
  if (local_2d != ';') {
    return pcStack_28;
  }
  goto LAB_00163e7d;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}